

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> __thiscall
slang::driver::Driver::createCompilation(Driver *this)

{
  bool bVar1;
  pointer this_00;
  Driver *in_RSI;
  shared_ptr<slang::syntax::SyntaxTree> local_80;
  shared_ptr<slang::syntax::SyntaxTree> *local_70;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *__range2;
  Bag local_40;
  undefined1 local_19;
  Driver *this_local;
  __single_object *compilation;
  
  local_19 = 0;
  this_local = this;
  createOptionBag(&local_40,in_RSI);
  std::make_unique<slang::ast::Compilation,slang::Bag>((Bag *)this);
  Bag::~Bag(&local_40);
  __end2 = std::
           vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ::begin(&in_RSI->syntaxTrees);
  tree = (shared_ptr<slang::syntax::SyntaxTree> *)
         std::
         vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
         ::end(&in_RSI->syntaxTrees);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                                     *)&tree), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
               ::operator*(&__end2);
    this_00 = std::
              unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>::
              operator->((unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>
                          *)this);
    std::shared_ptr<slang::syntax::SyntaxTree>::shared_ptr(&local_80,local_70);
    ast::Compilation::addSyntaxTree(this_00,&local_80);
    std::shared_ptr<slang::syntax::SyntaxTree>::~shared_ptr(&local_80);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
    ::operator++(&__end2);
  }
  return (__uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
          )(__uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Compilation> Driver::createCompilation() const {
    auto compilation = std::make_unique<Compilation>(createOptionBag());
    for (auto& tree : syntaxTrees)
        compilation->addSyntaxTree(tree);

    return compilation;
}